

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1M2L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  iterator __position;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar5;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this;
  long lVar6;
  ostream *poVar7;
  float *pfVar8;
  char *__function;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float tz;
  Matrix<float,_3,_1,_0,_3,_1> t;
  vector<float,_std::allocator<float>_> realRoots;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  Matrix<float,_3,_3,_0,_3,_3> R;
  DstEvaluatorType dstEvaluator;
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  SrcEvaluatorType srcEvaluator;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  trans;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines3;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines2;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Matrix<float,_5,_1,_0,_5,_1> factors;
  undefined1 local_9d8 [16];
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  float *local_998;
  Matrix<float,_4,_4,_0,_4,_4> *local_990;
  float *local_988;
  undefined8 local_980;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  undefined1 local_968 [16];
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *local_938;
  float local_930;
  float local_92c;
  float local_928;
  Scalar local_924;
  Scalar local_920;
  float local_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  uint uStack_904;
  uint uStack_900;
  uint uStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  Matrix<float,_3,_3,_0,_3,_3> local_8c4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  undefined4 uStack_824;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  SrcXprType local_7c0;
  float *local_7b8;
  vector<float,_std::allocator<float>_> local_7b0;
  Matrix<float,_4,_4,_0,_4,_4> local_798;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  undefined1 local_748 [16];
  undefined1 local_738 [16];
  Matrix<float,_3,_3,_0,_3,_3> local_728;
  Matrix<float,_4,_4,_0,_4,_4> local_6f8;
  undefined1 local_6b8 [12];
  undefined1 auStack_6ac [8];
  undefined8 local_6a4;
  float fStack_69c;
  float afStack_698 [13];
  undefined1 auStack_664 [36];
  float fStack_640;
  float afStack_63c [6];
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  undefined1 local_618 [16];
  float local_608;
  undefined4 uStack_604;
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  float local_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_598 [40];
  undefined4 local_570;
  undefined4 local_56c;
  float fStack_568;
  undefined4 uStack_564;
  float fStack_560;
  undefined4 local_55c;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_558;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  local_540;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  local_528;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  local_510;
  undefined1 local_4f8 [16];
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  float fStack_4a0;
  float fStack_49c;
  Matrix<float,_4,_4,_0,_4,_4> *local_498;
  assign_op<float,_float> *local_490;
  Matrix<float,_4,_4,_0,_4,_4> *local_488;
  undefined8 local_480;
  undefined1 local_478 [12];
  undefined1 auStack_46c [8];
  undefined8 local_464;
  float fStack_45c;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 local_448;
  float fStack_440;
  undefined8 uStack_43c;
  undefined8 uStack_434;
  undefined8 uStack_42c;
  undefined1 auStack_424 [36];
  float fStack_400;
  undefined8 uStack_3fc;
  undefined8 local_3f4;
  float local_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  Matrix<float,_4,_4,_0,_4,_4> local_1a8;
  Matrix<float,_3,_1,_0,_3,_1> local_164;
  Matrix<float,_3,_1,_0,_3,_1> local_158;
  Matrix<float,_5,_1,_0,_5,_1> local_14c;
  Matrix<float,_6,_1,_0,_6,_1> local_138;
  Matrix<float,_6,_1,_0,_6,_1> local_118;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_f8;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_b8;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_78;
  
  pfVar8 = *(float **)lCPair;
  if ((*(float **)(lCPair + 8) == pfVar8) && ((ulong)(*(long *)(lPair + 8) - *(long *)lPair) < 0x41)
     ) {
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!"
                            );
    std::endl<char,std::char_traits<char>>(poVar7);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._0_8_ = *(undefined8 *)pfVar8;
  local_78.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._8_8_ = *(undefined8 *)(pfVar8 + 2);
  local_78.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar8 + 4);
  local_78.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar8 + 6);
  local_78.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar8 + 8);
  local_78.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar8 + 10);
  local_78.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._0_8_ = *(undefined8 *)(pfVar8 + 0xc);
  local_78.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._8_8_ = *(undefined8 *)(pfVar8 + 0xe);
  local_938 = (vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
               *)__return_storage_ptr__;
  getPluckerCoord<float>(&local_510,&local_78);
  pfVar8 = *(float **)lPair;
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._0_8_ = *(undefined8 *)pfVar8;
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._8_8_ = *(undefined8 *)(pfVar8 + 2);
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar8 + 4);
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar8 + 6);
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar8 + 8);
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar8 + 10);
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._0_8_ = *(undefined8 *)(pfVar8 + 0xc);
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._8_8_ = *(undefined8 *)(pfVar8 + 0xe);
  getPluckerCoord<float>(&local_528,&local_b8);
  lVar6 = *(long *)lPair;
  local_f8.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._0_8_ = *(undefined8 *)(lVar6 + 0x40);
  local_f8.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._8_8_ = *(undefined8 *)(lVar6 + 0x48);
  local_f8.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(lVar6 + 0x50);
  local_f8.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(lVar6 + 0x58);
  local_f8.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(lVar6 + 0x60);
  local_f8.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(lVar6 + 0x68);
  local_f8.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._0_8_ = *(undefined8 *)(lVar6 + 0x70);
  local_f8.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._8_8_ = *(undefined8 *)(lVar6 + 0x78);
  getPluckerCoord<float>(&local_540,&local_f8);
  local_118.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          ((local_510.
            super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array;
  local_118.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (((local_510.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array + 2);
  local_118.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (((local_510.
               super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array + 4
            );
  local_138.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          local_510.
          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array;
  local_138.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (local_510.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 2);
  local_138.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (local_510.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 4)
  ;
  getPredefinedTransformations1M1Q<float>(&local_558,&local_118,&local_138);
  local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          ((local_558.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array;
  local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (((local_558.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 2);
  local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (((local_558.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 4
            );
  local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _24_8_ = *(undefined8 *)
            (((local_558.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 6
            );
  local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _32_8_ = *(undefined8 *)
            (((local_558.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array + 8
            );
  local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _40_8_ = *(undefined8 *)
            (((local_558.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array +
            10);
  uVar1 = *(undefined8 *)
           (((local_558.
              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array +
           0xc);
  uVar2 = *(undefined8 *)
           (((local_558.
              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.array +
           0xe);
  local_598._0_8_ = &local_798;
  local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
       = (float)uVar1;
  local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
       = (float)((ulong)uVar1 >> 0x20);
  local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
       = (float)uVar2;
  local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
       = (float)((ulong)uVar2 >> 0x20);
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          local_558.
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (local_558.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (local_558.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4)
  ;
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _24_8_ = *(undefined8 *)
            (local_558.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6)
  ;
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _32_8_ = *(undefined8 *)
            (local_558.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8)
  ;
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _40_8_ = *(undefined8 *)
            (local_558.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10
            );
  uVar1 = *(undefined8 *)
           (local_558.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc
           );
  uVar2 = *(undefined8 *)
           (local_558.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe
           );
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
       = (float)uVar1;
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
       = (float)((ulong)uVar1 >> 0x20);
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
       = (float)uVar2;
  local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
       = (float)((ulong)uVar2 >> 0x20);
  local_478._0_4_ = 1.0;
  local_478._4_8_ = 0;
  auStack_46c = (undefined1  [8])0x0;
  local_464 = 0;
  fStack_45c = 1.0;
  uStack_458 = 0;
  uStack_450 = 0;
  local_448 = 0;
  fStack_440 = 1.0;
  uStack_43c = 0;
  uStack_434 = 0;
  uStack_42c = 0;
  auStack_424._0_4_ = 1.0;
  auStack_424._4_8_ = 0;
  auStack_424._12_8_ = 0;
  auStack_424._20_8_ = 0;
  auStack_424._28_4_ = 1.0;
  stack0xfffffffffffffbfc = 0;
  uStack_3fc = 0;
  local_3f4 = 0;
  local_3ec = 1.0;
  local_6b8._0_4_ = 1.0;
  local_6b8._4_4_ = 0.0;
  local_6b8._8_4_ = 0.0;
  auStack_6ac = (undefined1  [8])0x0;
  local_6a4 = 0;
  fStack_69c = 1.0;
  afStack_698[0] = 0.0;
  afStack_698[1] = 0.0;
  afStack_698[2] = 0.0;
  afStack_698[3] = 0.0;
  afStack_698[4] = 0.0;
  afStack_698[5] = 0.0;
  afStack_698[6] = 1.0;
  afStack_698[7] = 0.0;
  afStack_698[8] = 0.0;
  afStack_698[9] = 0.0;
  afStack_698[10] = 0.0;
  afStack_698[0xb] = 0.0;
  afStack_698[0xc] = 0.0;
  auStack_664._0_4_ = 1.0;
  auStack_664._4_4_ = 0.0;
  auStack_664._8_4_ = 0.0;
  auStack_664._12_4_ = 0.0;
  auStack_664._16_4_ = 0.0;
  auStack_664._20_4_ = 0.0;
  auStack_664._24_4_ = 0.0;
  auStack_664._28_4_ = 1.0;
  auStack_664._32_4_ = 0.0;
  fStack_640 = 0.0;
  afStack_63c[0] = 0.0;
  afStack_63c[1] = 0.0;
  afStack_63c[2] = 0.0;
  afStack_63c[3] = 0.0;
  afStack_63c[4] = 1.0;
  local_9d8._8_8_ = 3;
  local_9c8 = (Matrix<float,_4,_4,_0,_4,_4> *)0x3;
  local_9b8 = 0;
  uStack_9b0 = (XprTypeNested)0x0;
  local_9a8 = 6;
  local_9d8._0_8_ = (XprTypeNested)local_478;
  uStack_9c0 = (long)local_478;
  local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = (XprTypeNested)local_478;
  local_4d8 = (undefined1  [8])&local_6f8;
  uStack_4d0 = (long)local_598;
  local_4c8 = (long)&local_728;
  uStack_4c0 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)local_9d8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_4d8);
  local_9d8._0_8_ = auStack_424;
  local_9d8._8_8_ = 3;
  local_9c8 = (Matrix<float,_4,_4,_0,_4,_4> *)0x3;
  local_9b8 = 3;
  uStack_9b0 = (XprTypeNested)0x3;
  local_9a8 = 6;
  uStack_9c0 = (long)local_478;
  local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = local_9d8._0_8_;
  local_4d8 = (undefined1  [8])&local_6f8;
  uStack_4d0 = (long)local_598;
  local_4c8 = (long)&local_728;
  uStack_4c0 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)local_9d8;
  local_598._0_8_ = &local_798;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_4d8);
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  local_158.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_598,&local_158);
  local_4d8 = (undefined1  [8])auStack_46c;
  local_9a8 = 0;
  uStack_9a0 = 0;
  uStack_9c0 = 3;
  local_9b8 = 3;
  local_998 = (float *)0x4;
  uStack_4d0 = 3;
  local_4c8 = 3;
  local_4b8 = 3;
  uStack_4b0 = 0;
  local_4a8 = 6;
  local_9d8._0_8_ = (Matrix<float,_3,_3,_0,_3,_3> *)local_598;
  local_9c8 = &local_798;
  uStack_9b0 = &local_798;
  uStack_4c0 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)local_478;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<float,float>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)local_4d8,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)local_9d8,(assign_op<float,_float> *)&local_6f8,(type)0x0);
  local_9d8._8_8_ = 3;
  local_9c8 = (Matrix<float,_4,_4,_0,_4,_4> *)0x3;
  local_9b8 = 0;
  uStack_9b0 = (XprTypeNested)0x0;
  local_9a8 = 6;
  local_9d8._0_8_ = (XprTypeNested)local_6b8;
  uStack_9c0 = (long)local_6b8;
  local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = (XprTypeNested)local_6b8;
  local_4d8 = (undefined1  [8])&local_6f8;
  uStack_4d0 = (long)local_598;
  local_4c8 = (long)&local_728;
  uStack_4c0 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)local_9d8;
  local_598._0_8_ = &local_1a8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_4d8);
  local_9d8._0_8_ = auStack_664;
  local_9d8._8_8_ = 3;
  local_9c8 = (Matrix<float,_4,_4,_0,_4,_4> *)0x3;
  local_9b8 = 3;
  uStack_9b0 = (XprTypeNested)0x3;
  local_9a8 = 6;
  uStack_9c0 = (long)local_6b8;
  local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = local_9d8._0_8_;
  local_4d8 = (undefined1  [8])&local_6f8;
  uStack_4d0 = (long)local_598;
  local_4c8 = (long)&local_728;
  uStack_4c0 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)local_9d8;
  local_598._0_8_ = &local_1a8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_4d8);
  local_164.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_164.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  local_164.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_598,&local_164);
  local_4d8 = (undefined1  [8])auStack_6ac;
  local_9a8 = 0;
  uStack_9a0 = 0;
  uStack_9c0 = 3;
  local_9b8 = 3;
  local_998 = (float *)0x4;
  uStack_4d0 = 3;
  local_4c8 = 3;
  local_4b8 = 3;
  uStack_4b0 = 0;
  local_4a8 = 6;
  local_9d8._0_8_ = (Matrix<float,_3,_3,_0,_3,_3> *)local_598;
  local_9c8 = &local_1a8;
  uStack_9b0 = &local_1a8;
  uStack_4c0 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)local_6b8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<float,float>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)local_4d8,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)local_9d8,(assign_op<float,_float> *)&local_6f8,(type)0x0);
  fVar16 = ((local_528.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  fVar12 = ((local_528.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  fVar13 = ((local_528.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  fVar17 = ((local_528.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  fVar25 = ((local_528.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  fVar20 = ((local_528.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  local_8d8 = fVar20 * fStack_400 +
              fVar25 * (float)auStack_424._12_4_ +
              fVar17 * uStack_434._4_4_ +
              fVar13 * (float)local_448 + fVar12 * local_464._4_4_ + fVar16 * (float)local_478._0_4_
  ;
  fStack_954 = fVar20 * (float)uStack_3fc +
               fVar25 * (float)auStack_424._16_4_ +
               fVar17 * (float)uStack_42c +
               fVar13 * local_448._4_4_ + fVar12 * fStack_45c + fVar16 * (float)local_478._4_4_;
  fStack_950 = fVar20 * uStack_3fc._4_4_ +
               fVar25 * (float)auStack_424._20_4_ +
               fVar17 * uStack_42c._4_4_ +
               fVar13 * fStack_440 + fVar12 * (float)uStack_458 + fVar16 * (float)local_478._8_4_;
  fStack_94c = fVar20 * (float)local_3f4 +
               fVar25 * (float)auStack_424._24_4_ +
               fVar17 * (float)auStack_424._0_4_ +
               fVar13 * (float)uStack_43c +
               fVar12 * uStack_458._4_4_ + fVar16 * (float)auStack_46c._0_4_;
  fVar19 = local_3f4._4_4_ * fVar20 + (float)auStack_424._28_4_ * fVar25 +
           (float)auStack_424._4_4_ * fVar17 +
           uStack_43c._4_4_ * fVar13 + (float)uStack_450 * fVar12 +
           (float)auStack_46c._4_4_ * fVar16;
  local_748 = ZEXT416((uint)fVar19);
  fVar22 = fVar20 * local_3ec + fVar25 * (float)auStack_424._32_4_ +
           fVar17 * (float)auStack_424._8_4_ +
           fVar13 * (float)uStack_434 + fVar12 * uStack_450._4_4_ + fVar16 * (float)local_464;
  local_738 = ZEXT416((uint)fVar22);
  fVar16 = local_528.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  fVar12 = local_528.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  fVar13 = local_528.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  fVar17 = local_528.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  fVar25 = local_528.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  fVar20 = local_528.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  local_758 = fVar20 * fStack_640 +
              fVar25 * (float)auStack_664._12_4_ +
              fVar17 * afStack_698[10] +
              fVar13 * afStack_698[4] + fVar12 * local_6a4._4_4_ + fVar16 * (float)local_6b8._0_4_;
  fStack_974 = fVar20 * afStack_63c[0] +
               fVar25 * (float)auStack_664._16_4_ +
               fVar17 * afStack_698[0xb] +
               fVar13 * afStack_698[5] + fVar12 * fStack_69c + fVar16 * (float)local_6b8._4_4_;
  fStack_8a0 = fVar20 * afStack_63c[1] +
               fVar25 * (float)auStack_664._20_4_ +
               fVar17 * afStack_698[0xc] +
               fVar13 * afStack_698[6] + fVar12 * afStack_698[0] + fVar16 * (float)local_6b8._8_4_;
  fStack_89c = fVar20 * afStack_63c[2] +
               fVar25 * (float)auStack_664._24_4_ +
               fVar17 * (float)auStack_664._0_4_ +
               fVar13 * afStack_698[7] + fVar12 * afStack_698[1] + fVar16 * (float)auStack_6ac._0_4_
  ;
  fVar10 = afStack_63c[3] * fVar20 + (float)auStack_664._28_4_ * fVar25 +
           (float)auStack_664._4_4_ * fVar17 +
           afStack_698[8] * fVar13 + afStack_698[2] * fVar12 + (float)auStack_6ac._4_4_ * fVar16;
  fVar18 = fVar20 * afStack_63c[4] + fVar25 * (float)auStack_664._32_4_ +
           fVar17 * (float)auStack_664._8_4_ +
           fVar13 * afStack_698[9] + fVar12 * afStack_698[3] + fVar16 * (float)local_6a4;
  local_618 = ZEXT416((uint)fVar18);
  fVar16 = ((local_540.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  fVar12 = ((local_540.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  fVar13 = ((local_540.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  fVar17 = ((local_540.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  fVar25 = ((local_540.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  fVar20 = ((local_540.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  fVar11 = fVar20 * fStack_400 +
           fVar25 * (float)auStack_424._12_4_ +
           fVar17 * uStack_434._4_4_ +
           fVar13 * (float)local_448 + fVar12 * local_464._4_4_ + fVar16 * (float)local_478._0_4_;
  fVar14 = fVar20 * (float)uStack_3fc +
           fVar25 * (float)auStack_424._16_4_ +
           fVar17 * (float)uStack_42c +
           fVar13 * local_448._4_4_ + fVar12 * fStack_45c + fVar16 * (float)local_478._4_4_;
  fStack_1f0 = fVar20 * uStack_3fc._4_4_ +
               fVar25 * (float)auStack_424._20_4_ +
               fVar17 * uStack_42c._4_4_ +
               fVar13 * fStack_440 + fVar12 * (float)uStack_458 + fVar16 * (float)local_478._8_4_;
  fStack_204 = fVar20 * (float)local_3f4 +
               fVar25 * (float)auStack_424._24_4_ +
               fVar17 * (float)auStack_424._0_4_ +
               fVar13 * (float)uStack_43c +
               fVar12 * uStack_458._4_4_ + fVar16 * (float)auStack_46c._0_4_;
  fVar15 = local_3f4._4_4_ * fVar20 + (float)auStack_424._28_4_ * fVar25 +
           (float)auStack_424._4_4_ * fVar17 +
           uStack_43c._4_4_ * fVar13 + (float)uStack_450 * fVar12 +
           (float)auStack_46c._4_4_ * fVar16;
  fVar21 = local_3ec * fVar20 + (float)auStack_424._32_4_ * fVar25 +
           (float)auStack_424._8_4_ * fVar17 +
           (float)uStack_434 * fVar13 + uStack_450._4_4_ * fVar12 + (float)local_464 * fVar16;
  fVar16 = local_540.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  fVar12 = local_540.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  fVar13 = local_540.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  fVar17 = local_540.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  fVar25 = local_540.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  fVar20 = local_540.
           super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  fVar23 = fVar20 * fStack_640 +
           fVar25 * (float)auStack_664._12_4_ +
           fVar17 * afStack_698[10] +
           fVar13 * afStack_698[4] + fVar12 * local_6a4._4_4_ + fVar16 * (float)local_6b8._0_4_;
  local_2d8 = fVar20 * afStack_63c[0] +
              fVar25 * (float)auStack_664._16_4_ +
              fVar17 * afStack_698[0xb] +
              fVar13 * afStack_698[5] + fVar12 * fStack_69c + fVar16 * (float)local_6b8._4_4_;
  fVar24 = fVar20 * afStack_63c[1] +
           fVar25 * (float)auStack_664._20_4_ +
           fVar17 * afStack_698[0xc] +
           fVar13 * afStack_698[6] + fVar12 * afStack_698[0] + fVar16 * (float)local_6b8._8_4_;
  local_1b8 = fVar20 * afStack_63c[2] +
              fVar25 * (float)auStack_664._24_4_ +
              fVar17 * (float)auStack_664._0_4_ +
              fVar13 * afStack_698[7] + fVar12 * afStack_698[1] + fVar16 * (float)auStack_6ac._0_4_;
  local_908 = afStack_63c[3] * fVar20 + (float)auStack_664._28_4_ * fVar25 +
              (float)auStack_664._4_4_ * fVar17 +
              afStack_698[8] * fVar13 + afStack_698[2] * fVar12 + (float)auStack_6ac._4_4_ * fVar16;
  local_1f8 = afStack_63c[4] * fVar20 + (float)auStack_664._32_4_ * fVar25 +
              (float)auStack_664._8_4_ * fVar17 +
              afStack_698[9] * fVar13 + afStack_698[3] * fVar12 + (float)local_6a4 * fVar16;
  auVar3._4_4_ = fStack_954;
  auVar3._0_4_ = local_8d8;
  auVar3._8_4_ = fStack_950;
  auVar3._12_4_ = fStack_94c;
  local_7d8 = -local_8d8;
  fStack_7d4 = -fStack_954;
  fStack_7d0 = -fStack_950;
  fStack_7cc = -fStack_94c;
  local_958 = local_8d8 + local_8d8;
  local_8f8 = fStack_954 + fStack_954;
  fVar12 = local_8d8 * 4.0;
  local_1c8 = fVar12 * fStack_204;
  fVar13 = fStack_954 * 4.0;
  local_208 = fStack_204 * fVar13;
  fVar16 = local_958 * fVar14;
  fVar17 = local_8f8 * fVar14;
  local_7e8 = fStack_94c + fStack_94c;
  local_7f8 = fVar19 + fVar19;
  local_228 = fStack_950 * -2.0 * fVar14;
  local_238 = fVar22 * -2.0 * fVar14;
  uStack_234 = 0;
  uStack_230 = 0;
  uStack_22c = 0;
  fStack_314 = -fStack_954;
  fStack_310 = -fStack_950;
  fStack_30c = -fStack_94c;
  local_318 = -fVar12 * fVar14;
  local_248 = fVar13 * fVar14;
  local_92c = fStack_94c * -4.0 * fVar14;
  local_968._8_4_ = fStack_950;
  local_968._0_8_ = auVar3._8_8_;
  local_968._12_4_ = fStack_94c;
  local_5e8 = local_958 * fVar11;
  fVar25 = local_8f8 * fVar11;
  uStack_7f4 = 0;
  uStack_7f0 = 0;
  uStack_7ec = 0;
  local_930 = fVar19 * 4.0 * fVar14;
  fVar26 = (fVar19 * fVar11 * fStack_974 * local_2d8 +
           fStack_954 * fVar15 * local_758 * local_2d8 +
           ((local_758 * fStack_954 * fVar14 * local_908 +
            fStack_954 * fVar11 * fVar10 * local_2d8 +
            ((fVar14 * local_7d8 * fStack_974 * local_908 +
             ((fStack_94c * fVar11 * local_758 * local_2d8 +
              fStack_954 * fStack_204 * local_758 * fVar23 +
              local_758 * fStack_954 * fVar11 * local_1b8 +
              ((fStack_89c * fVar14 * local_7d8 * fVar23 +
               (fStack_89c * local_8d8 * fVar11 * local_2d8 -
               local_8d8 * fVar11 * fStack_974 * local_1b8)) -
              fStack_204 * local_8d8 * fStack_974 * fVar23)) -
             fVar14 * fStack_94c * local_758 * fVar23)) -
            fVar15 * local_8d8 * fStack_974 * local_2d8)) - fStack_954 * fVar14 * fVar10 * fVar23))
           - fVar14 * fVar19 * fStack_974 * fVar23;
  local_1e8 = local_8d8 * fStack_1f0 * fStack_974 * local_1f8;
  auVar4._4_4_ = fStack_974;
  auVar4._0_4_ = local_758;
  auVar4._8_4_ = fStack_8a0;
  auVar4._12_4_ = fStack_89c;
  local_1d8 = fStack_954 * fStack_1f0 * local_758 * local_1f8;
  local_218 = local_958 * fStack_1f0 * local_758 * local_1f8;
  local_1f8 = fStack_1f0 * local_8f8 * fStack_974 * local_1f8;
  local_838 = fStack_950 * fVar14 * fVar18 * fVar23;
  local_4f8._8_4_ = fStack_8a0;
  local_4f8._0_8_ = auVar4._8_8_;
  local_4f8._12_4_ = fStack_89c;
  local_828 = fVar22 * fVar14 * fStack_8a0 * fVar23;
  uStack_824 = 0;
  uStack_820 = 0;
  uStack_81c = 0;
  local_308 = fStack_89c * local_5e8 * fVar23;
  local_2e8 = local_758 * local_958 * fStack_204 * fVar23;
  local_388 = local_758 * local_7e8 * fVar11;
  local_2f8 = local_388 * fVar23;
  local_3d8 = fStack_974 * fVar16;
  local_368 = fStack_89c * fVar16;
  local_898 = fVar16 * fVar10 * fVar23;
  local_338 = local_758 * local_958 * fVar15;
  local_808 = local_958 * fVar15 * fStack_974;
  local_2c8 = local_808 * fVar23;
  local_3c8 = local_758 * fVar25;
  local_348 = fStack_89c * fVar25;
  local_3a8 = fVar25 * fVar10;
  local_2b8 = local_3a8 * fVar23;
  local_298 = fStack_89c * fVar17 * fVar23;
  local_5c8 = local_758 * local_8f8 * fStack_204;
  local_818 = local_8f8 * fStack_204 * fStack_974 * fVar23;
  local_358 = local_758 * local_8f8 * fVar15;
  local_288 = local_358 * fVar23;
  local_398 = local_758 * local_7e8 * fVar14;
  local_888 = local_7e8 * fVar14 * fStack_974 * fVar23;
  local_5f8 = local_7f8 * fVar11 * fStack_974;
  uStack_5f4 = 0;
  uStack_5f0 = 0;
  uStack_5ec = 0;
  local_268 = local_5f8 * fVar23;
  uStack_264 = 0;
  uStack_260 = 0;
  uStack_25c = 0;
  local_258 = local_758 * local_7f8 * fVar14 * fVar23;
  local_858 = fStack_950 * -2.0 * fVar11 * fVar18 * fVar23;
  local_848 = fVar22 * -2.0 * fVar11 * fStack_8a0 * fVar23;
  uStack_844 = 0;
  uStack_840 = 0;
  uStack_83c = 0;
  local_378 = local_958 * fStack_204 * fStack_974;
  local_3e8 = local_5c8 * fVar23;
  local_918 = fVar17 * fVar10 * fVar23;
  local_5b8 = fVar13 * fVar15 * fStack_974 * fVar23;
  local_3b8 = local_7f8 * fVar14 * fStack_974;
  uStack_3b4 = 0;
  uStack_3b0 = 0;
  uStack_3ac = 0;
  local_608 = local_3b8 * fVar23;
  uStack_604 = 0;
  uStack_600 = 0;
  uStack_5fc = 0;
  local_2a8 = local_8d8 * fVar21 * fStack_974 * fVar24;
  local_278 = fStack_954 * fVar21 * local_758 * fVar24;
  local_328 = local_958 * fVar21 * local_758 * fVar24;
  fVar24 = fVar21 * local_8f8 * fStack_974 * fVar24;
  local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       fStack_974 * local_5e8 * local_908;
  local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       local_758 * fVar16 * local_908;
  local_5a8 = fStack_974 * fVar17 * local_908;
  fVar16 = local_758 * local_5e8 * local_1b8;
  local_978 = fStack_974 * fVar25 * local_1b8;
  fVar25 = local_758 * fVar17 * local_1b8;
  local_868 = fStack_950 * fVar11 * fVar18 * local_2d8;
  local_878 = fVar22 * fVar11 * fStack_8a0 * local_2d8;
  uStack_874 = 0;
  uStack_870 = 0;
  uStack_86c = 0;
  fVar22 = local_5e8 * fVar10 * local_2d8;
  local_5c8 = local_5c8 * local_2d8;
  fVar20 = local_7e8 * fVar11 * fStack_974 * local_2d8;
  local_5d8 = local_758 * local_7f8 * fVar11 * local_2d8;
  fVar14 = fVar17 * fVar10 * local_2d8;
  fVar21 = local_8f8 * fVar15 * fStack_974 * local_2d8;
  fVar18 = local_228 * fVar18 * local_2d8;
  local_14c.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
       local_238 * fStack_8a0 * local_2d8;
  local_14c.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2] =
       local_608 +
       local_930 * local_758 * local_2d8 +
       ((local_92c * fStack_974 * local_2d8 +
        (((local_208 * fStack_974 * local_2d8 +
          local_918 +
          local_248 * fStack_89c * local_2d8 +
          ((((fVar13 * fVar11 * fStack_974 * local_908 +
             local_808 * local_2d8 +
             local_318 * fVar10 * local_2d8 +
             local_3d8 * local_908 +
             fVar11 * fVar19 * 4.0 * local_758 * fVar23 +
             local_398 * fVar23 +
             fStack_94c * -4.0 * fVar11 * fStack_974 * fVar23 +
             (((fStack_89c * fVar13 * fVar11 * fVar23 +
               (((local_378 * fVar23 +
                 local_1c8 * local_758 * local_2d8 +
                 local_368 * fVar23 +
                 local_758 * local_318 * local_1b8 +
                 (((local_758 * fVar12 * fVar11 * local_908 + fStack_974 * local_5e8 * local_1b8) -
                  fStack_89c * local_5e8 * local_2d8) - fVar12 * fVar11 * fVar10 * fVar23)) -
                fVar15 * fVar12 * local_758 * fVar23) - local_3c8 * local_1b8)) - local_3e8) -
             local_388 * local_2d8)) - local_3a8 * local_2d8) - local_758 * fVar17 * local_908) -
          fStack_974 * local_248 * local_1b8)) - local_358 * local_2d8) - local_5b8)) -
       local_5f8 * local_2d8);
  local_14c.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[1] =
       (((((((((((((((((((((((local_308 - fVar16) - local_2e8) + local_2f8 +
                           local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[3]) - fVar22) -
                         local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[7]) - local_3d8 * local_1b8) + local_368 * local_2d8
                        + local_898 + local_378 * local_2d8) - local_338 * local_2d8) - local_2c8) -
                    local_3c8 * local_908) - local_978) + local_348 * local_2d8 + local_2b8 + fVar25
                  ) - local_298) - local_5c8) - local_818) + local_288) - fVar20) +
             local_398 * local_2d8 + local_888 + local_5d8 + local_268) - local_258) + local_218 +
          local_328) - local_5a8) + fVar14) - fVar21) + local_858 + local_3b8 * local_2d8 +
       local_848 + local_1f8 + fVar24 + fVar18 +
       local_14c.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
       [3];
  local_14c.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
       (((((((((((((((((((((((fVar16 - local_308) + local_2e8) - local_2f8) -
                          local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[3]) + fVar22 +
                          local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[7] + local_3d8 * local_1b8) - local_368 * local_2d8
                        ) - local_898) - local_378 * local_2d8) + local_338 * local_2d8 + local_2c8
                      + local_3c8 * local_908 + local_978) - local_348 * local_2d8) - local_2b8) -
                  fVar25) + local_298 + local_5c8 + local_818) - local_288) + fVar20) -
              local_398 * local_2d8) - local_888) - local_5d8) - local_268) + local_258 + local_218
           + local_328 + local_5a8) - fVar14) + fVar21 + local_858) - local_3b8 * local_2d8) +
       local_848 + local_1f8 + fVar24 + fVar18 +
       local_14c.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
       [3];
  local_14c.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
       ((((((local_1e8 + fVar26 + local_2a8) - local_1d8) - local_278) - local_868) + local_838) -
       local_878) + local_828;
  local_14c.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
       (((((fVar26 - local_1e8) - local_2a8) + local_1d8 + local_278 + local_868) - local_838) +
       local_878) - local_828;
  fStack_970 = fStack_974;
  fStack_96c = fStack_974;
  local_948 = fStack_954;
  fStack_944 = fStack_954;
  fStack_940 = fStack_954;
  fStack_93c = fStack_954;
  fStack_914 = fStack_954;
  fStack_910 = fStack_954;
  fStack_90c = fStack_954;
  fStack_8f4 = fStack_954;
  fStack_8f0 = fStack_954;
  fStack_8ec = fStack_954;
  local_8e8 = fStack_94c;
  fStack_8e4 = fStack_94c;
  fStack_8e0 = fStack_94c;
  fStack_8dc = fStack_94c;
  fStack_8d4 = fStack_954;
  fStack_8d0 = fStack_950;
  fStack_8cc = fStack_94c;
  local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       fStack_974;
  local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       fStack_974;
  local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       fStack_974;
  local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       fStack_974;
  fStack_894 = fStack_954;
  fStack_890 = fStack_950;
  fStack_88c = fStack_94c;
  fStack_884 = fStack_94c;
  fStack_880 = fStack_94c;
  fStack_87c = fStack_94c;
  fStack_864 = fStack_94c;
  fStack_860 = fStack_950;
  fStack_85c = fStack_94c;
  fStack_854 = fStack_94c;
  fStack_850 = fStack_950;
  fStack_84c = fStack_94c;
  fStack_834 = fStack_94c;
  fStack_830 = fStack_950;
  fStack_82c = fStack_94c;
  fStack_814 = fStack_954;
  fStack_810 = fStack_954;
  fStack_80c = fStack_954;
  fStack_804 = fStack_954;
  fStack_800 = fStack_950;
  fStack_7fc = fStack_94c;
  fStack_7e4 = fStack_94c;
  fStack_7e0 = fStack_94c;
  fStack_7dc = fStack_94c;
  fStack_754 = fStack_974;
  fStack_750 = fStack_8a0;
  fStack_74c = fStack_89c;
  afStack_63c[5] = fStack_89c;
  fStack_624 = fStack_89c;
  fStack_620 = fStack_89c;
  fStack_61c = fStack_89c;
  fStack_5e4 = fStack_954;
  fStack_5e0 = fStack_950;
  fStack_5dc = fStack_94c;
  fStack_5d4 = fStack_974;
  fStack_5d0 = fStack_8a0;
  fStack_5cc = fStack_89c;
  fStack_5c4 = fStack_974;
  fStack_5c0 = fStack_8a0;
  fStack_5bc = fStack_89c;
  fStack_5b4 = fStack_954;
  fStack_5b0 = fStack_954;
  fStack_5ac = fStack_954;
  fStack_5a4 = fStack_974;
  fStack_5a0 = fStack_974;
  fStack_59c = fStack_974;
  local_4e8 = fStack_974;
  fStack_4e4 = fStack_974;
  fStack_4e0 = fStack_974;
  fStack_4dc = fStack_974;
  fStack_3e4 = fStack_974;
  fStack_3e0 = fStack_8a0;
  fStack_3dc = fStack_89c;
  fStack_3d4 = fStack_974;
  fStack_3d0 = fStack_974;
  fStack_3cc = fStack_974;
  fStack_3c4 = fStack_974;
  fStack_3c0 = fStack_8a0;
  fStack_3bc = fStack_89c;
  fStack_3a4 = fStack_954;
  fStack_3a0 = fStack_954;
  fStack_39c = fStack_954;
  fStack_394 = fStack_974;
  fStack_390 = fStack_8a0;
  fStack_38c = fStack_89c;
  fStack_384 = fStack_974;
  fStack_380 = fStack_8a0;
  fStack_37c = fStack_89c;
  fStack_374 = fStack_954;
  fStack_370 = fStack_950;
  fStack_36c = fStack_94c;
  fStack_364 = fStack_89c;
  fStack_360 = fStack_89c;
  fStack_35c = fStack_89c;
  fStack_354 = fStack_974;
  fStack_350 = fStack_8a0;
  fStack_34c = fStack_89c;
  fStack_344 = fStack_89c;
  fStack_340 = fStack_89c;
  fStack_33c = fStack_89c;
  fStack_334 = fStack_974;
  fStack_330 = fStack_8a0;
  fStack_32c = fStack_89c;
  fStack_324 = fStack_954;
  fStack_320 = fStack_950;
  fStack_31c = fStack_94c;
  fStack_304 = fStack_89c;
  fStack_300 = fStack_89c;
  fStack_2fc = fStack_89c;
  fStack_2f4 = fStack_974;
  fStack_2f0 = fStack_8a0;
  fStack_2ec = fStack_89c;
  fStack_2e4 = fStack_974;
  fStack_2e0 = fStack_8a0;
  fStack_2dc = fStack_89c;
  fStack_2d4 = local_2d8;
  fStack_2d0 = local_2d8;
  fStack_2cc = local_2d8;
  fStack_2c4 = fStack_954;
  fStack_2c0 = fStack_950;
  fStack_2bc = fStack_94c;
  fStack_2b4 = fStack_954;
  fStack_2b0 = fStack_954;
  fStack_2ac = fStack_954;
  fStack_2a4 = fStack_954;
  fStack_2a0 = fStack_950;
  fStack_29c = fStack_94c;
  fStack_294 = fStack_89c;
  fStack_290 = fStack_89c;
  fStack_28c = fStack_89c;
  fStack_284 = fStack_974;
  fStack_280 = fStack_8a0;
  fStack_27c = fStack_89c;
  fStack_274 = fStack_954;
  fStack_270 = fStack_954;
  fStack_26c = fStack_954;
  fStack_254 = fStack_974;
  fStack_250 = fStack_8a0;
  fStack_24c = fStack_89c;
  fStack_244 = fStack_954;
  fStack_240 = fStack_954;
  fStack_23c = fStack_954;
  fStack_224 = fStack_94c;
  fStack_220 = fStack_950;
  fStack_21c = fStack_94c;
  fStack_214 = fStack_954;
  fStack_210 = fStack_950;
  fStack_20c = fStack_94c;
  fStack_200 = fStack_204;
  fStack_1fc = fStack_204;
  fStack_1f4 = fStack_204;
  fStack_1ec = fStack_204;
  fStack_1e4 = fStack_954;
  fStack_1e0 = fStack_950;
  fStack_1dc = fStack_94c;
  fStack_1d4 = fStack_954;
  fStack_1d0 = fStack_954;
  fStack_1cc = fStack_954;
  fStack_1c4 = fStack_954;
  fStack_1c0 = fStack_950;
  fStack_1bc = fStack_94c;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  o4_roots<float>(&local_7b0,&local_14c);
  if (local_7b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_7b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_908 = -(float)local_748._0_4_;
    uStack_904 = local_748._4_4_ ^ 0x80000000;
    uStack_900 = local_748._8_4_ ^ 0x80000000;
    uStack_8fc = local_748._12_4_ ^ 0x80000000;
    local_968._0_4_ = (float)local_968._0_4_ * (float)local_618._0_4_;
    local_738._0_4_ = (float)local_738._0_4_ * (float)local_4f8._0_4_;
    local_748._0_4_ =
         (float)local_748._0_4_ * local_4e8 +
         local_948 * fVar10 + local_8d8 * afStack_63c[5] + local_8e8 * local_758 +
         (float)local_968._0_4_ + (float)local_738._0_4_;
    local_7d8 = local_7d8 * afStack_63c[5];
    local_8e8 = -(local_8e8 * local_758);
    fStack_8e4 = -fStack_8e4;
    fStack_8e0 = -fStack_8e0;
    fStack_8dc = -fStack_8dc;
    fVar12 = -local_948;
    local_908 = local_908 * local_4e8;
    fVar16 = -local_8f8 * afStack_63c[5];
    fVar17 = local_958 * fVar10;
    local_7e8 = local_7e8 * local_4e8;
    uStack_7f4 = uStack_7f4 ^ 0x80000000;
    uStack_7f0 = uStack_7f0 ^ 0x80000000;
    uStack_7ec = uStack_7ec ^ 0x80000000;
    local_7f8 = -local_7f8 * local_758;
    local_8d8 = local_8d8 * local_4e8;
    local_948 = local_948 * local_758 - local_8d8;
    fVar13 = fVar12 * local_758;
    local_958 = local_958 * local_758;
    local_8f8 = local_8f8 * local_4e8;
    uVar9 = 0;
    do {
      fVar25 = local_7b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      local_91c = -(local_7f8 * fVar25 +
                   local_7e8 * fVar25 +
                   fVar16 * fVar25 +
                   fVar17 * fVar25 +
                   (float)local_738._0_4_ * fVar25 * fVar25 +
                   (float)local_968._0_4_ * fVar25 * fVar25 +
                   local_908 * fVar25 * fVar25 +
                   fVar10 * fVar12 * fVar25 * fVar25 +
                   fVar25 * local_8e8 * fVar25 +
                   local_7d8 * fVar25 * fVar25 + (float)local_748._0_4_) /
                  (local_8f8 * fVar25 +
                  local_958 * fVar25 +
                  fVar13 * fVar25 * fVar25 + local_8d8 * fVar25 * fVar25 + local_948);
      fVar20 = 1.0 - fVar25 * fVar25;
      local_9d8._0_8_ = &local_728;
      local_9d8._8_8_ = 0;
      local_9c8 = (Matrix<float,_4,_4,_0,_4,_4> *)0x1;
      uStack_9c0 = 1;
      local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = fVar20;
      local_4d8._0_4_ = fVar25 * -2.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_9d8,
                          (Scalar *)local_4d8);
      local_598._0_4_ = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar5,(Scalar *)local_598);
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = fVar25 + fVar25;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar5,(Scalar *)&local_6f8);
      local_7c0.m_xpr._0_4_ = fVar20;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar5,(Scalar *)&local_7c0);
      local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar5,(Scalar *)&local_8c4);
      local_920 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar5,&local_920);
      local_924 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar5,&local_924);
      fVar25 = fVar25 * fVar25 + 1.0;
      local_928 = fVar25;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar5,&local_928);
      if ((uStack_9c0 + local_9d8._8_8_ != 3) || (local_9c8 != (Matrix<float,_4,_4,_0,_4,_4> *)0x3))
      {
        __function = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
        ;
LAB_001a7ed3:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
      }
      fVar25 = 1.0 / fVar25;
      local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] * fVar25;
      local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1] * fVar25;
      local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] * fVar25;
      local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] * fVar25;
      local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = fVar25 * local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[4];
      local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = fVar25 * local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[5];
      local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = fVar25 * local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[6];
      local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = fVar25 * local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[7];
      local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = fVar25 * local_728.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                     .m_data.array[8];
      local_9d8._8_8_ = 0;
      local_9c8 = (Matrix<float,_4,_4,_0,_4,_4> *)0x1;
      uStack_9c0 = 1;
      local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 0.0;
      local_4d8._0_4_ = 0.0;
      local_9d8._0_8_ = &local_8c4;
      this = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_9d8,
                        (Scalar *)local_4d8);
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(this,&local_91c);
      if ((uStack_9c0 + local_9d8._8_8_ != 3) || (local_9c8 != (Matrix<float,_4,_4,_0,_4,_4> *)0x1))
      {
        __function = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
        ;
        goto LAB_001a7ed3;
      }
      local_598._0_4_ = 1.0;
      local_598._4_4_ = 0.0;
      local_598._8_4_ = 0.0;
      local_598._12_4_ = 0.0;
      local_598._16_4_ = 0.0;
      local_598._20_4_ = 1.0;
      local_598._24_4_ = 0.0;
      local_598._28_4_ = 0.0;
      local_598._32_8_ = 0;
      local_570 = 0x3f800000;
      local_56c = 0;
      fStack_568 = 0.0;
      uStack_564 = 0;
      fStack_560 = 0.0;
      local_55c = 0x3f800000;
      lVar6 = 0;
      pfVar8 = (float *)&local_728;
      do {
        *(float *)(local_598 + lVar6 + 8) = pfVar8[2];
        *(undefined8 *)(local_598 + lVar6) = *(undefined8 *)pfVar8;
        pfVar8 = pfVar8 + 3;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x30);
      fStack_560 = local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2];
      fStack_568 = local_8c4.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[0];
      local_7c0.m_xpr = &local_1a8;
      local_7b8 = (float *)local_598;
      Eigen::internal::
      Assignment<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<float,_4,_4,_0,_4,_4> *)local_9d8,&local_7c0,
            (assign_op<float,_float> *)local_4d8);
      local_998 = local_7b8;
      local_988 = local_7b8;
      local_980 = 4;
      fVar25 = *local_7b8;
      fVar20 = local_7b8[1];
      fVar24 = local_7b8[2];
      fVar11 = local_7b8[3];
      local_4d8._0_4_ =
           fVar11 * (float)local_9a8 +
           fVar24 * (float)local_9b8 + fVar20 * (float)local_9c8 + fVar25 * (float)local_9d8._0_4_;
      local_4d8._4_4_ =
           fVar11 * local_9a8._4_4_ +
           fVar24 * local_9b8._4_4_ + fVar20 * local_9c8._4_4_ + fVar25 * (float)local_9d8._4_4_;
      uStack_4d0._0_4_ =
           fVar11 * (float)uStack_9a0 +
           fVar24 * (float)uStack_9b0 + fVar20 * (float)uStack_9c0 + fVar25 * (float)local_9d8._8_4_
      ;
      uStack_4d0._4_4_ =
           fVar11 * uStack_9a0._4_4_ +
           fVar24 * uStack_9b0._4_4_ + fVar20 * uStack_9c0._4_4_ + fVar25 * (float)local_9d8._12_4_;
      fVar25 = local_7b8[4];
      fVar20 = local_7b8[5];
      fVar24 = local_7b8[6];
      fVar11 = local_7b8[7];
      local_4c8._0_4_ =
           fVar11 * (float)local_9a8 +
           fVar24 * (float)local_9b8 + fVar20 * (float)local_9c8 + fVar25 * (float)local_9d8._0_4_;
      local_4c8._4_4_ =
           fVar11 * local_9a8._4_4_ +
           fVar24 * local_9b8._4_4_ + fVar20 * local_9c8._4_4_ + fVar25 * (float)local_9d8._4_4_;
      fVar14 = fVar11 * (float)uStack_9a0 +
               fVar24 * (float)uStack_9b0 +
               fVar20 * (float)uStack_9c0 + fVar25 * (float)local_9d8._8_4_;
      fVar15 = fVar11 * uStack_9a0._4_4_ +
               fVar24 * uStack_9b0._4_4_ +
               fVar20 * uStack_9c0._4_4_ + fVar25 * (float)local_9d8._12_4_;
      uStack_4c0 = (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                    *)CONCAT44(fVar15,fVar14);
      fVar25 = local_7b8[8];
      fVar20 = local_7b8[9];
      fVar24 = local_7b8[10];
      fVar11 = local_7b8[0xb];
      local_4b8._0_4_ =
           fVar11 * (float)local_9a8 +
           fVar24 * (float)local_9b8 + fVar20 * (float)local_9c8 + fVar25 * (float)local_9d8._0_4_;
      local_4b8._4_4_ =
           fVar11 * local_9a8._4_4_ +
           fVar24 * local_9b8._4_4_ + fVar20 * local_9c8._4_4_ + fVar25 * (float)local_9d8._4_4_;
      uStack_4b0._0_4_ =
           fVar11 * (float)uStack_9a0 +
           fVar24 * (float)uStack_9b0 + fVar20 * (float)uStack_9c0 + fVar25 * (float)local_9d8._8_4_
      ;
      uStack_4b0._4_4_ =
           fVar11 * uStack_9a0._4_4_ +
           fVar24 * uStack_9b0._4_4_ + fVar20 * uStack_9c0._4_4_ + fVar25 * (float)local_9d8._12_4_;
      fVar25 = local_7b8[0xc];
      fVar20 = local_7b8[0xd];
      fVar24 = local_7b8[0xe];
      fVar11 = local_7b8[0xf];
      fVar18 = fVar11 * (float)local_9a8 +
               fVar24 * (float)local_9b8 +
               fVar20 * (float)local_9c8 + fVar25 * (float)local_9d8._0_4_;
      fVar19 = fVar11 * local_9a8._4_4_ +
               fVar24 * local_9b8._4_4_ + fVar20 * local_9c8._4_4_ + fVar25 * (float)local_9d8._4_4_
      ;
      fStack_4a0 = fVar11 * (float)uStack_9a0 +
                   fVar24 * (float)uStack_9b0 +
                   fVar20 * (float)uStack_9c0 + fVar25 * (float)local_9d8._8_4_;
      fStack_49c = fVar11 * uStack_9a0._4_4_ +
                   fVar24 * uStack_9b0._4_4_ +
                   fVar20 * uStack_9c0._4_4_ + fVar25 * (float)local_9d8._12_4_;
      local_4a8 = CONCAT44(fVar19,fVar18);
      local_498 = &local_798;
      local_480 = 4;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[3] * fStack_4a0 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[2] * (float)uStack_4b0 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1] * fVar14 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] * (float)uStack_4d0;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[3] * fStack_49c +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[2] * uStack_4b0._4_4_ +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1] * fVar15 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] * uStack_4d0._4_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[7] * fVar18 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[6] * (float)local_4b8 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[5] * (float)local_4c8 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[4] * (float)local_4d8._0_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[7] * fVar19 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[6] * local_4b8._4_4_ +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[5] * local_4c8._4_4_ +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[4] * (float)local_4d8._4_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[7] * fStack_4a0 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[6] * (float)uStack_4b0 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[5] * fVar14 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[4] * (float)uStack_4d0;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[7] * fStack_49c +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[6] * uStack_4b0._4_4_ +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[5] * fVar15 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[4] * uStack_4d0._4_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xb] * fVar18 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[10] * (float)local_4b8 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[9] * (float)local_4c8 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[8] * (float)local_4d8._0_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xb] * fVar19 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[10] * local_4b8._4_4_ +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[9] * local_4c8._4_4_ +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[8] * (float)local_4d8._4_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xb] * fStack_4a0 +
             local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[10] * (float)uStack_4b0 +
             local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[9] * fVar14 +
             local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[8] * (float)uStack_4d0;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xb] * fStack_49c +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[10] * uStack_4b0._4_4_ +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[9] * fVar15 +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[8] * uStack_4d0._4_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xf] * fVar18 +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xe] * (float)local_4b8 +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xd] * (float)local_4c8 +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xc] * (float)local_4d8._0_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xf] * fVar19 +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xe] * local_4b8._4_4_ +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xd] * local_4c8._4_4_ +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xc] * (float)local_4d8._4_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xf] * fStack_4a0 +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xe] * (float)uStack_4b0 +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xd] * fVar14 +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xc] * (float)uStack_4d0;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xf] * fStack_49c +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xe] * uStack_4b0._4_4_ +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xd] * fVar15 +
              local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xc] * uStack_4d0._4_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[3] * fVar19 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[2] * local_4b8._4_4_ +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1] * local_4c8._4_4_ +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] * (float)local_4d8._4_4_;
      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[3] * fVar18 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[2] * (float)local_4b8 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1] * (float)local_4c8 +
            local_798.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] * (float)local_4d8._0_4_;
      __position._M_current = *(Matrix<float,_4,_4,_0,_4,_4> **)(local_938 + 8);
      local_990 = (Matrix<float,_4,_4,_0,_4,_4> *)local_9d8;
      local_490 = (assign_op<float,_float> *)local_4d8;
      local_488 = local_498;
      if (__position._M_current == *(Matrix<float,_4,_4,_0,_4,_4> **)(local_938 + 0x10)) {
        std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>(local_938,__position,&local_6f8);
      }
      else {
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 0xc) =
             CONCAT44(local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xd],
                      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xc]);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 0xe) =
             CONCAT44(local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xf],
                      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xe]);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 8) =
             CONCAT44(local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[9],
                      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[8]);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 10) =
             CONCAT44(local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xb],
                      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[10]);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 4) =
             CONCAT44(local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[5],
                      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[4]);
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 6) =
             CONCAT44(local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[7],
                      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[6]);
        *(undefined8 *)
         ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
         m_storage.m_data.array =
             local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._0_8_;
        *(ulong *)(((__position._M_current)->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + 2) =
             CONCAT44(local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[3],
                      local_6f8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2]);
        *(Matrix<float,_4,_4,_0,_4,_4> **)(local_938 + 8) = __position._M_current + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)local_7b0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_7b0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_7b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_7b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_7b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_7b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_558.
      super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_558.
                    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_558.
                          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_558.
                          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_540.
      super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_540.
                    super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_540.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_540.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_528.
      super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_528.
                    super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_528.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_528.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_510.
      super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_510.
                    super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_510.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_510.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          *)local_938;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M2L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){
	
	// check input vectors size
	if(lCPair.size() < 1 && lPair.size() < 2){
		std::cerr << "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;

	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines2 = getPluckerCoord(lPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines3 = getPluckerCoord(lPair[1]);
	

	// move frames to first line and z axis with its direction
	std::vector<Eigen::Matrix<floatPrec,4,4>> trans = getPredefinedTransformations1M1Q(lines1[0],lines1[1]);
	Eigen::Matrix<floatPrec,4,4> TU1 = trans[0], TU2 = trans[1];
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform lines to new frame
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,6,1> lU3 = TUL1*lines2[0];
	Eigen::Matrix<floatPrec,6,1> lU4 = TUL2*lines2[1];
	Eigen::Matrix<floatPrec,6,1> lU5 = TUL1*lines3[0];
	Eigen::Matrix<floatPrec,6,1> lU6 = TUL2*lines3[1];

	// define coeffs
	floatPrec l11 = lU3(0),l12 = lU3(1),l13 = lU3(2),l14 = lU3(3),l15 = lU3(4),l16 = lU3(5);
	floatPrec l21 = lU5(0),l22 = lU5(1),l23 = lU5(2),l24 = lU5(3),l25 = lU5(4),l26 = lU5(5);
	floatPrec m11 = lU4(0),m12 = lU4(1),m13 = lU4(2),m14 = lU4(3),m15 = lU4(4),m16 = lU4(5);
	floatPrec m21 = lU6(0),m22 = lU6(1),m23 = lU6(2),m24 = lU6(3),m25 = lU6(4),m26 = lU6(5);

	floatPrec a = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22     + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 + l11*l23*m12*m26 + l11*l26*m12*m23 - l12*l23*m11*m26 - l12*l26*m11*m23 - l13*l21*m16*m22 + l13*l22*m16*m21 - l16*l21*m13*m22 + l16*l22*m13*m21;
	floatPrec b = 2*l11*l21*m14*m21 - 2*l11*l21*m11*m24 - 2*l11*l24*m11*m21 + 2*l14*l21*m11*m21 + 2*l11*l21*m12*m25 - 2*l11*l21*m15*m22 - 2*l11*l22*m11*m25 - 2*l11*l22*m12*m24 + 2*l11*l22*m14*m22 + 2*l11*l22*m15*m21 + 2*l11*l24*m12*m22 - 2*l11*l25*m11*m22 - 2*l11*l25*m12*m21 - 2*l12*l21*m11*m25 - 2*l12*l21*m12*m24 + 2*l12*l21*m14*m22 + 2*l12*l21*m15*m21 + 2*l12*l22*m11*m24 - 2*l12*l22*m14*m21 - 2*l12*l24*m11*m22 - 2*l12*l24*m12*m21 + 2*l12*l25*m11*m21 - 2*l14*l21*m12*m22 + 2*l14*l22*m11*m22 + 2*l14*l22*m12*m21 + 2*l15*l21*m11*m22 + 2*l15*l21*m12*m21 - 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 - 2*l12*l22*m12*m25 + 2*l12*l22*m15*m22 - 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 + 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec c = 4*l11*l21*m11*m25 + 2*l11*l21*m12*m24 - 2*l11*l21*m14*m22 - 4*l11*l21*m15*m21 - 4*l11*l22*m11*m24 + 2*l11*l22*m14*m21 + 4*l11*l24*m11*m22 + 2*l11*l24*m12*m21 - 4*l11*l25*m11*m21 - 2*l12*l21*m11*m24 + 4*l12*l21*m14*m21 - 2*l12*l24*m11*m21 - 2*l14*l21*m11*m22 - 4*l14*l21*m12*m21 + 2*l14*l22*m11*m21 + 4*l15*l21*m11*m21 + 2*l11*l22*m12*m25 - 4*l11*l22*m15*m22 + 2*l11*l25*m12*m22 + 4*l12*l21*m12*m25 - 2*l12*l21*m15*m22 - 2*l12*l22*m11*m25 - 4*l12*l22*m12*m24 + 4*l12*l22*m14*m22 + 2*l12*l22*m15*m21 + 4*l12*l24*m12*m22 - 2*l12*l25*m11*m22 - 4*l12*l25*m12*m21 - 4*l14*l22*m12*m22 - 2*l15*l21*m12*m22 + 4*l15*l22*m11*m22 + 2*l15*l22*m12*m21; 
	floatPrec d = 2*l11*l21*m11*m24 - 2*l11*l21*m14*m21 + 2*l11*l24*m11*m21 - 2*l14*l21*m11*m21 - 2*l11*l21*m12*m25 + 2*l11*l21*m15*m22 + 2*l11*l22*m11*m25 + 2*l11*l22*m12*m24 - 2*l11*l22*m14*m22 - 2*l11*l22*m15*m21 - 2*l11*l24*m12*m22 + 2*l11*l25*m11*m22 + 2*l11*l25*m12*m21 + 2*l12*l21*m11*m25 + 2*l12*l21*m12*m24 - 2*l12*l21*m14*m22 - 2*l12*l21*m15*m21 - 2*l12*l22*m11*m24 + 2*l12*l22*m14*m21 + 2*l12*l24*m11*m22 + 2*l12*l24*m12*m21 - 2*l12*l25*m11*m21 + 2*l14*l21*m12*m22 - 2*l14*l22*m11*m22 - 2*l14*l22*m12*m21 - 2*l15*l21*m11*m22 - 2*l15*l21*m12*m21 + 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 + 2*l12*l22*m12*m25 - 2*l12*l22*m15*m22 + 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 - 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec e = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22 + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 - l11*l23*m12*m26 - l11*l26*m12*m23 + l12*l23*m11*m26 + l12*l26*m11*m23 + l13*l21*m16*m22 - l13*l22*m16*m21 + l16*l21*m13*m22 - l16*l22*m13*m21;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = a;
	factors(1, 0) = b;
	factors(2, 0) = c;
	factors(3, 0) = d;
	factors(4, 0) = e;
	vector<floatPrec> realRoots = o4_roots(factors);
	for(size_t iter = 0; iter < realRoots.size(); iter++){
		floatPrec s = realRoots[iter];
		
		floatPrec tz = -(l11*m14 + l14*m11 + l12*m15 + l15*m12 + l13*m16 + l16*m13 - l11*m14*s*s - l14*m11*s*s - l12*m15*s*s - l15*m12*s*s + l13*m16*s*s + l16*m13*s*s + 2*l11*m15*s - 2*l12*m14*s + 2*l14*m12*s - 2*l15*m11*s)/(l12*m11 - l11*m12 + l11*m12*s*s - l12*m11*s*s + 2*l11*m11*s + 2*l12*m12*s);

		Eigen::Matrix<floatPrec,3,3> R;
		R << 1-s*s, -2*s, 0, 2*s, 1-s*s, 0, 0, 0, 1+s*s;
		R = 1/(1+s*s)*R;
		Eigen::Matrix<floatPrec,3,1> t;
		t << 0,0,tz;
		Eigen::Matrix<floatPrec,4,4> Tw = Eigen::Matrix<floatPrec,4,4>::Identity(), sol;
		Tw.topLeftCorner(3,3) = R;
		Tw.topRightCorner(3,1) = t;
		sol = TU2.inverse()*Tw*TU1;
		out.push_back(sol);
	}

	return out;
}